

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O3

bool __thiscall HighsMipSolverData::moreHeuristicsAllowed(HighsMipSolverData *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if (this->mipsolver->submip == true) {
    return (double)this->heuristic_lp_iterations <
           (double)this->total_lp_iterations * this->heuristic_effort;
  }
  dVar4 = (this->pruned_treeweight).hi + (this->pruned_treeweight).lo;
  if (((0.001 <= dVar4) || (9 < this->num_leaves - this->num_leaves_before_run)) ||
     (999 < this->num_nodes - this->num_nodes_before_run)) {
    lVar1 = this->total_lp_iterations;
    lVar2 = this->heuristic_lp_iterations;
    if (lVar2 < ((lVar1 - lVar2) - this->sb_lp_iterations >> 1) + 100000) {
      lVar3 = ((this->heuristic_lp_iterations_before_run + lVar1) -
              (lVar2 + this->total_lp_iterations_before_run)) +
              (this->sb_lp_iterations_before_run - this->sb_lp_iterations);
      dVar5 = dVar4;
      if (dVar4 <= 0.01) {
        dVar5 = 0.01;
      }
      dVar6 = 0.8;
      if (dVar4 <= 0.8) {
        dVar6 = dVar4;
      }
      dVar6 = dVar6 / 0.8;
      if (dVar6 <= 0.37499999999999994) {
        dVar6 = 0.37499999999999994;
      }
      if ((double)lVar2 / ((double)lVar3 / dVar5 + (double)(lVar1 - lVar3)) <
          dVar6 * this->heuristic_effort) {
        return true;
      }
    }
  }
  else if ((double)this->heuristic_lp_iterations <
           (double)this->total_lp_iterations * this->heuristic_effort + 10000.0) {
    return true;
  }
  return false;
}

Assistant:

bool HighsMipSolverData::moreHeuristicsAllowed() const {
  // in the beginning of the search and in sub-MIP heuristics we only allow
  // what is proportionally for the currently spent effort plus an initial
  // offset. This is because in a sub-MIP we usually do a truncated search and
  // therefore should not extrapolate the time we spent for heuristics as in
  // the other case. Moreover, since we estimate the total effort for
  // exploring the tree based on the weight of the already pruned nodes, the
  // estimated effort the is not expected to be a good prediction in the
  // beginning.
  if (mipsolver.submip) {
    return heuristic_lp_iterations < total_lp_iterations * heuristic_effort;
  } else if (pruned_treeweight < 1e-3 &&
             num_leaves - num_leaves_before_run < 10 &&
             num_nodes - num_nodes_before_run < 1000) {
    // in the main MIP solver allow an initial offset of 10000 heuristic LP
    // iterations
    if (heuristic_lp_iterations <
        total_lp_iterations * heuristic_effort + 10000)
      return true;
  } else if (heuristic_lp_iterations <
             100000 + ((total_lp_iterations - heuristic_lp_iterations -
                        sb_lp_iterations) >>
                       1)) {
    // compute the node LP iterations in the current run as only those should be
    // used when estimating the total required LP iterations to complete the
    // search
    int64_t heur_iters_curr_run =
        heuristic_lp_iterations - heuristic_lp_iterations_before_run;
    int64_t sb_iters_curr_run = sb_lp_iterations - sb_lp_iterations_before_run;
    int64_t node_iters_curr_run = total_lp_iterations -
                                  total_lp_iterations_before_run -
                                  heur_iters_curr_run - sb_iters_curr_run;
    // now estimate the total fraction of LP iterations that we have spent on
    // heuristics by assuming the node iterations of the current run will
    // grow proportional to the pruned weight of the current tree and the
    // iterations spent for anything else are just added as an offset
    double total_heuristic_effort_estim =
        heuristic_lp_iterations /
        ((total_lp_iterations - node_iters_curr_run) +
         node_iters_curr_run / std::max(0.01, double(pruned_treeweight)));
    // since heuristics help most in the beginning of the search, we want to
    // spent the time we have for heuristics in the first 80% of the tree
    // exploration. Additionally we want to spent the proportional effort
    // of heuristics that is allowed in the first 30% of tree exploration as
    // fast as possible, which is why we have the max(0.3/0.8,...).
    // Hence, in the first 30% of the tree exploration we allow to spent all
    // effort available for heuristics in that part of the search as early as
    // possible, whereas after that we allow the part that is proportionally
    // adequate when we want to spent all available time in the first 80%.
    if (total_heuristic_effort_estim <
        std::max(0.3 / 0.8, std::min(double(pruned_treeweight), 0.8) / 0.8) *
            heuristic_effort) {
      // printf(
      //     "heuristic lp iterations: %ld, total_lp_iterations: %ld, "
      //     "total_heur_effort_estim = %.3f%%\n",
      //     heuristic_lp_iterations, total_lp_iterations,
      //     total_heuristic_effort_estim);
      return true;
    }
  }

  return false;
}